

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TeamCityReporter::testRunEnded(TeamCityReporter *this,TestRunStats *runStats)

{
  ostream *poVar1;
  undefined1 in_stack_00000008 [16];
  string local_30 [32];
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "##teamcity[testSuiteFinished name=\'");
  (anonymous_namespace)::escape_abi_cxx11_((StringRef)in_stack_00000008);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void TeamCityReporter::testRunEnded( TestRunStats const& runStats ) {
        m_stream << "##teamcity[testSuiteFinished name='"
               << escape( runStats.runInfo.name ) << "']\n";
    }